

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O3

void mserialize::detail::BuiltinDeserializer<std::forward_list<int,_std::allocator<int>_>,_void>::
     deserialize_elems<InputStream>(_Fwd_list_impl param_1,uint param_2,undefined8 *param_3)

{
  std::forward_list<int,_std::allocator<int>_>::resize
            ((forward_list<int,_std::allocator<int>_> *)param_1._M_head._M_next,(ulong)param_2);
  while (param_1._M_head._M_next =
              (_Fwd_list_node_base)((_Fwd_list_node_base *)param_1._M_head._M_next)->_M_next,
        (_Fwd_list_impl)param_1._M_head._M_next != (_Fwd_list_impl)0x0) {
    std::istream::read((char *)*param_3,(long)param_1._M_head._M_next + 8);
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::false_type  /* no insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    resize(has_resize<Sequence>{}, s, size);

    deserialize_elems_noinsert(
      is_sequence_batch_deserializable<Sequence>{},
      is_proxy_sequence<Sequence>{},
      s, size, istream
    );
  }